

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

int lj_opt_fwd_tptr(jit_State *J,IRRef lim)

{
  ushort uVar1;
  uint ta_00;
  AliasRet AVar2;
  int iVar3;
  IRIns *pIVar4;
  IRIns *newref;
  IRRef ref;
  IRRef ta;
  IRRef lim_local;
  jit_State *J_local;
  
  ta_00 = (uint)(J->fold).ins.field_0.op1;
  uVar1 = J->chain[0x3b];
  while( true ) {
    newref._4_4_ = (uint)uVar1;
    if (newref._4_4_ <= lim) {
      iVar3 = fwd_aa_tab_clear(J,lim,ta_00);
      return iVar3;
    }
    pIVar4 = (J->cur).ir + newref._4_4_;
    if ((ta_00 == (pIVar4->field_0).op1) ||
       (AVar2 = aa_table(J,ta_00,(uint)(pIVar4->field_0).op1), AVar2 != ALIAS_NO)) break;
    uVar1 = (pIVar4->field_0).prev;
  }
  return 0;
}

Assistant:

int LJ_FASTCALL lj_opt_fwd_tptr(jit_State *J, IRRef lim)
{
  IRRef ta = fins->op1;
  IRRef ref = J->chain[IR_NEWREF];
  while (ref > lim) {
    IRIns *newref = IR(ref);
    if (ta == newref->op1 || aa_table(J, ta, newref->op1) != ALIAS_NO)
      return 0;  /* Conflict. */
    ref = newref->prev;
  }
  return fwd_aa_tab_clear(J, lim, ta);
}